

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.hpp
# Opt level: O1

vec3f __thiscall schuttejoe::GgxVndf(schuttejoe *this,vec3f wo,float roughness,float u1,float u2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  vec3f vVar15;
  
  fVar8 = wo.z;
  fVar10 = -fVar8;
  if (-fVar8 <= fVar8) {
    fVar10 = fVar8;
  }
  fVar12 = wo.x * roughness;
  fVar13 = wo.y * roughness;
  fVar4 = fVar10 * fVar10 + fVar12 * fVar12 + fVar13 * fVar13;
  fVar7 = 0.0;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  fVar10 = fVar10 * fVar4;
  fVar12 = fVar12 * fVar4;
  fVar13 = fVar13 * fVar4;
  if (0.999 <= fVar13) {
    fVar4 = 1.0;
    fVar9 = 0.0;
  }
  else {
    fVar7 = fVar13 * -0.0 + fVar12;
    fVar4 = fVar13 * 0.0 + -fVar10;
    fVar9 = fVar10 * 0.0 + fVar12 * -0.0;
    fVar5 = fVar7 * fVar7 + fVar4 * fVar4 + fVar9 * fVar9;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    fVar5 = 1.0 / fVar5;
    fVar7 = fVar7 * fVar5;
    fVar4 = fVar4 * fVar5;
    fVar9 = fVar9 * fVar5;
  }
  fVar5 = 1.0 / (fVar10 + 1.0);
  if (u1 < 0.0) {
    fVar6 = sqrtf(u1);
  }
  else {
    fVar6 = SQRT(u1);
  }
  if (fVar5 <= u2) {
    fVar5 = ((u2 - fVar5) / (1.0 - fVar5)) * PI + PI;
    dVar3 = (double)fVar10;
  }
  else {
    fVar5 = (u2 / fVar5) * PI;
    dVar3 = 1.0;
  }
  dVar1 = cos((double)fVar5);
  dVar2 = sin((double)fVar5);
  fVar11 = (float)((double)fVar6 * dVar1);
  fVar6 = (float)(dVar2 * (double)fVar6 * dVar3);
  fVar5 = (1.0 - fVar11 * fVar11) - fVar6 * fVar6;
  if (fVar5 <= 0.0) {
    fVar5 = 0.0;
  }
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  dVar3 = (double)(fVar10 * fVar5 + (fVar13 * fVar4 - fVar9 * fVar12) * fVar6 + fVar7 * fVar11);
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  if (fVar8 < 0.0) {
    dVar3 = -dVar3;
  }
  fVar14 = (float)dVar3;
  fVar8 = (fVar5 * fVar12 + (fVar10 * fVar9 - fVar13 * fVar7) * fVar6 + fVar11 * fVar4) * roughness;
  fVar7 = (fVar5 * fVar13 + (fVar12 * fVar7 - fVar10 * fVar4) * fVar6 + fVar11 * fVar9) * roughness;
  fVar10 = fVar14 * fVar14 + fVar8 * fVar8 + fVar7 * fVar7;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar10 = 1.0 / fVar10;
  vVar15.x = fVar10 * fVar8;
  vVar15.y = fVar10 * fVar7;
  vVar15.z = fVar10 * fVar14;
  return vVar15;
}

Assistant:

vec3f GgxVndf(vec3f wo, float roughness, float u1, float u2)
{
    float ttt = 1;
    if (wo.z < 0) {
        wo.z = -wo.z;
        ttt = -1;
    }
    // -- Stretch the view vector so we are sampling as though
    // -- roughness==1
    vec3f v = normalized(vec3f(wo.x * roughness,
                                wo.y * roughness,
                                wo.z ));

    // -- Build an orthonormal basis with v, t1, and t2
    vec3f t1 = (v.y < 0.999f) ? normalized(cross(v, vec3f(0,1,0))) : vec3f(1,0,0);
    vec3f t2 = cross(t1, v);

    // -- Choose a point on a disk with each half of the disk weighted
    // -- proportionally to its projection onto direction v
    float a = 1.0f / (1.0f + v.z);
    float r = sqrtf(u1);
    float phi = (u2 < a) ? (u2 / a) * PI 
                         : PI + (u2 - a) / (1.0f - a) * PI;
    float p1 = r * cos(phi);
    float p2 = r * sin(phi) * ((u2 < a) ? 1.0f : v.z);

    // -- Calculate the normal in this stretched tangent space
    vec3f n = p1 * t1 + p2 * t2
             + sqrtf(fmax(0.0f, 1.0f - p1 * p1 - p2 * p2)) * v;

    // -- unstretch and normalize the normal
    return normalized(vec3f(roughness * n.x,
                            roughness * n.y,
                            fmax(0.0f, n.z) * ttt));
}